

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O0

Bool IsValidAttrName(ctmbstr attr)

{
  Bool BVar1;
  uint uVar2;
  uint local_1c;
  uint c;
  uint i;
  ctmbstr attr_local;
  
  BVar1 = prvTidyIsLetter((int)*attr);
  if (BVar1 == no) {
    attr_local._4_4_ = no;
  }
  else {
    for (local_1c = 1; uVar2 = prvTidytmbstrlen(attr), local_1c < uVar2; local_1c = local_1c + 1) {
      BVar1 = prvTidyIsNamechar((int)attr[local_1c]);
      if (BVar1 == no) {
        return no;
      }
    }
    attr_local._4_4_ = yes;
  }
  return attr_local._4_4_;
}

Assistant:

static Bool IsValidAttrName( ctmbstr attr )
{
    uint i, c = attr[0];

    /* first character should be a letter */
    if (!TY_(IsLetter)(c))
        return no;

    /* remaining characters should be namechars */
    for( i = 1; i < TY_(tmbstrlen)(attr); i++)
    {
        c = attr[i];

        if (TY_(IsNamechar)(c))
            continue;

        return no;
    }

    return yes;
}